

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

string * polyscope::modeName_abi_cxx11_(TransparencyMode *m)

{
  int iVar1;
  int *in_RSI;
  string *in_RDI;
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11 [17];
  
  iVar1 = *in_RSI;
  if (iVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"None",local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  else if (iVar1 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Simple",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (iVar1 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Pretty",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
  }
  return in_RDI;
}

Assistant:

std::string modeName(const TransparencyMode& m) {
  switch (m) {
  case TransparencyMode::None:
    return "None";
  case TransparencyMode::Simple:
    return "Simple";
  case TransparencyMode::Pretty:
    return "Pretty";
  }
  return "";
}